

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dill_pkg.c
# Opt level: O0

void unpack_package(char *package,call_t *t,char **code_p)

{
  short sVar1;
  void *pvVar2;
  size_t sVar3;
  undefined8 *in_RDX;
  int *in_RSI;
  short *in_RDI;
  size_t call_len;
  dill_pkg_1 *pkg;
  char *p;
  int pkg_size;
  int count;
  short *local_28;
  int local_1c;
  
  local_28 = in_RDI + 8;
  if (*in_RDI != -0x4111) {
    printf("Not valid package\n");
  }
  if ((char)in_RDI[1] != '\x01') {
    printf("Not valid package version\n");
  }
  sVar1 = in_RDI[3];
  in_RSI[1] = (int)sVar1;
  *in_RSI = (int)sVar1;
  pvVar2 = dill_malloc((size_t)in_RDI);
  *(void **)(in_RSI + 2) = pvVar2;
  memset(*(void **)(in_RSI + 2),0,(long)in_RDI[3] << 5);
  for (local_1c = 0; local_1c < in_RDI[3]; local_1c = local_1c + 1) {
    *(undefined4 *)(*(long *)(in_RSI + 2) + (long)local_1c * 0x20) = *(undefined4 *)local_28;
    *(short **)(*(long *)(in_RSI + 2) + (long)local_1c * 0x20 + 0x10) = local_28 + 2;
    sVar3 = strlen(*(char **)(*(long *)(in_RSI + 2) + (long)local_1c * 0x20 + 0x10));
    local_28 = (short *)((sVar3 + 0xc & 0xfffffffffffffff8) + (long)local_28);
  }
  *in_RDX = local_28;
  return;
}

Assistant:

static void
unpack_package(char* package, call_t* t, char** code_p)
{
    int count;
    int pkg_size = sizeof(struct dill_pkg_1);
    char* p;
    struct dill_pkg_1* pkg = (struct dill_pkg_1*)package;

    pkg_size = (pkg_size + 7) & -8; /* round up to mod 8 */
    p = package + pkg_size;
    if (pkg->magic != 0xbeef)
        printf("Not valid package\n");
    if (pkg->pkg_version != 1)
        printf("Not valid package version\n");
    t->call_alloc = t->call_count = pkg->symbol_count;
    t->call_locs = malloc(sizeof(t->call_locs[0]) * pkg->symbol_count);
    memset(t->call_locs, 0, sizeof(t->call_locs[0]) * pkg->symbol_count);
    for (count = 0; count < pkg->symbol_count; count++) {
        size_t call_len;
        t->call_locs[count].loc = *((int*)p);
        t->call_locs[count].xfer_name = (p + sizeof(int));
        call_len = sizeof(int) + strlen(t->call_locs[count].xfer_name) + 1;
        call_len = (call_len + 7) & (size_t)-8; /* round up to mod 8 */
        p += call_len;
    }
    *code_p = p;
}